

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall
CLI::App::add_subcommand(App *this,string *subcommand_name,string *subcommand_description)

{
  bool bVar1;
  ulong uVar2;
  IncorrectConstruction *this_00;
  App *pAVar3;
  shared_ptr<CLI::App> local_c0;
  undefined1 local_a9;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  App_p subcom;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *subcommand_description_local;
  string *subcommand_name_local;
  App *this_local;
  
  local_20 = subcommand_description;
  subcommand_description_local = subcommand_name;
  subcommand_name_local = (string *)this;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = detail::valid_name_string(subcommand_name);
    if (!bVar1) {
      subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 1;
      this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"subcommand name is not valid",&local_41);
      IncorrectConstruction::IncorrectConstruction(this_00,&local_40);
      subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 0;
      __cxa_throw(this_00,&IncorrectConstruction::typeinfo,
                  IncorrectConstruction::~IncorrectConstruction);
    }
  }
  pAVar3 = (App *)operator_new(800);
  local_a9 = 1;
  ::std::__cxx11::string::string((string *)&local_88,(string *)subcommand_description);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)subcommand_name);
  App(pAVar3,&local_88,&local_a8,this);
  local_a9 = 0;
  ::std::shared_ptr<CLI::App>::shared_ptr<CLI::App,void>((shared_ptr<CLI::App> *)local_68,pAVar3);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  std::shared_ptr<CLI::App>::shared_ptr(&local_c0,(shared_ptr<CLI::App> *)local_68);
  pAVar3 = add_subcommand(this,&local_c0);
  std::shared_ptr<CLI::App>::~shared_ptr(&local_c0);
  std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)local_68);
  return pAVar3;
}

Assistant:

App *add_subcommand(std::string subcommand_name = "", std::string subcommand_description = "") {
        if(!subcommand_name.empty() && !detail::valid_name_string(subcommand_name)) {
            throw IncorrectConstruction("subcommand name is not valid");
        }
        CLI::App_p subcom = std::shared_ptr<App>(new App(std::move(subcommand_description), subcommand_name, this));
        return add_subcommand(std::move(subcom));
    }